

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

cmListFileBacktrace * __thiscall
cmListFileBacktrace::operator=(cmListFileBacktrace *this,cmListFileBacktrace *r)

{
  Entry *pEVar1;
  PositionType PVar2;
  cmState *pcVar3;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar4;
  cmStateSnapshot __tmp;
  cmListFileBacktrace tmp;
  cmListFileBacktrace local_38;
  
  cmListFileBacktrace(&local_38,r);
  pEVar1 = this->Cur;
  this->Cur = local_38.Cur;
  PVar2 = (this->Bottom).Position.Position;
  pcVar3 = (this->Bottom).State;
  pcVar4 = (this->Bottom).Position.Tree;
  (this->Bottom).Position.Position = local_38.Bottom.Position.Position;
  (this->Bottom).State = local_38.Bottom.State;
  (this->Bottom).Position.Tree = local_38.Bottom.Position.Tree;
  local_38.Bottom.State = pcVar3;
  local_38.Bottom.Position.Tree = pcVar4;
  local_38.Bottom.Position.Position = PVar2;
  local_38.Cur = pEVar1;
  ~cmListFileBacktrace(&local_38);
  return this;
}

Assistant:

cmListFileBacktrace& cmListFileBacktrace::operator=(
  cmListFileBacktrace const& r)
{
  cmListFileBacktrace tmp(r);
  std::swap(this->Cur, tmp.Cur);
  std::swap(this->Bottom, tmp.Bottom);
  return *this;
}